

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O2

int Curl_parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  __uid_t __uid;
  char *pcVar5;
  char *pcVar6;
  FILE *__stream;
  char *pcVar7;
  passwd *ppVar8;
  int iVar9;
  char cVar10;
  bool bVar11;
  int local_160;
  char *tok_buf;
  char netrcbuffer [256];
  
  if (*loginp == (char *)0x0) {
    bVar11 = false;
  }
  else {
    bVar11 = **loginp != '\0';
  }
  iVar9 = 1;
  pcVar6 = netrcfile;
  if (netrcfile == (char *)0x0) {
    pcVar5 = curl_getenv("HOME");
    pcVar7 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      __uid = geteuid();
      ppVar8 = getpwuid(__uid);
      if (ppVar8 == (passwd *)0x0) {
        return 1;
      }
      pcVar7 = ppVar8->pw_dir;
      if (pcVar7 == (char *)0x0) {
        return 1;
      }
    }
    pcVar6 = curl_maprintf("%s%s%s",pcVar7,"/",".netrc");
    if (pcVar5 != (char *)0x0) {
      (*Curl_cfree)(pcVar7);
    }
    if (pcVar6 == (char *)0x0) {
      return -1;
    }
  }
  __stream = fopen64(pcVar6,"r");
  if (netrcfile == (char *)0x0) {
    (*Curl_cfree)(pcVar6);
  }
  if (__stream != (FILE *)0x0) {
    iVar9 = 1;
    cVar10 = '\0';
    bVar1 = false;
    bVar2 = false;
    local_160 = 0;
    bVar3 = false;
    while ((pcVar6 = netrcbuffer, !bVar3 &&
           (pcVar7 = fgets(pcVar6,0x100,__stream), pcVar7 != (char *)0x0))) {
      while( true ) {
        pcVar6 = strtok_r(pcVar6," \t\n",&tok_buf);
        bVar3 = pcVar6 != (char *)0x0;
        if ((pcVar6 == (char *)0x0) ||
           ((((pcVar7 = *loginp, pcVar7 != (char *)0x0 && (*pcVar7 != '\0')) &&
             (*passwordp != (char *)0x0)) && (**passwordp != '\0')))) break;
        if (cVar10 == '\x02') {
          if (bVar1) {
            if (bVar11) {
              local_160 = Curl_strcasecompare(pcVar7,pcVar6);
            }
            else {
              (*Curl_cfree)(pcVar7);
              pcVar6 = (*Curl_cstrdup)(pcVar6);
              *loginp = pcVar6;
              if (pcVar6 == (char *)0x0) {
LAB_00514021:
                iVar9 = -1;
                goto LAB_00514029;
              }
            }
            bVar1 = false;
          }
          else {
            if (bVar2) {
              bVar1 = false;
              if ((bool)(bVar11 & local_160 == 0)) {
                cVar10 = '\x02';
                bVar2 = false;
                local_160 = 0;
                goto LAB_00513f68;
              }
              (*Curl_cfree)(*passwordp);
              pcVar6 = (*Curl_cstrdup)(pcVar6);
              *passwordp = pcVar6;
              if (pcVar6 == (char *)0x0) goto LAB_00514021;
              cVar10 = '\x02';
LAB_00514005:
              bVar1 = false;
              bVar2 = false;
              goto LAB_00513f68;
            }
            iVar4 = Curl_strcasecompare("login",pcVar6);
            if (iVar4 == 0) {
              iVar4 = Curl_strcasecompare("password",pcVar6);
              bVar1 = false;
              if (iVar4 == 0) {
                iVar4 = Curl_strcasecompare("machine",pcVar6);
                if (iVar4 != 0) {
                  local_160 = 0;
                }
                cVar10 = (iVar4 == 0) + '\x01';
                goto LAB_00514005;
              }
              bVar2 = true;
            }
            else {
              bVar1 = true;
              bVar2 = false;
            }
          }
          cVar10 = '\x02';
        }
        else {
          pcVar7 = host;
          if (cVar10 != '\x01') {
            iVar4 = Curl_strcasecompare("machine",pcVar6);
            if (iVar4 != 0) {
              cVar10 = '\x01';
              goto LAB_00513f68;
            }
            pcVar7 = "default";
          }
          iVar4 = Curl_strcasecompare(pcVar7,pcVar6);
          if (iVar4 != 0) {
            iVar9 = 0;
          }
          cVar10 = (iVar4 != 0) * '\x02';
        }
LAB_00513f68:
        pcVar6 = (char *)0x0;
      }
    }
LAB_00514029:
    fclose(__stream);
  }
  return iVar9;
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char **loginp,
                    char **passwordp,
                    char *netrcfile)
{
  FILE *file;
  int retcode=1;
  int specific_login = (*loginp && **loginp != 0);
  bool netrc_alloc = FALSE;
  enum host_lookup_state state=NOTHING;

  char state_login=0;      /* Found a login keyword */
  char state_password=0;   /* Found a password keyword */
  int state_our_login=FALSE;  /* With specific_login, found *our* login name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    bool home_alloc = FALSE;
    char *home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      char pwbuf[1024];
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = strdup(pw.pw_dir);
        if(!home)
          return CURLE_OUT_OF_MEMORY;
        home_alloc = TRUE;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw= getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of memory) */

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(home_alloc)
      free(home);
    if(!netrcfile) {
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(netrc_alloc)
    free(netrcfile);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done=FALSE;
    char netrcbuffer[256];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok=strtok_r(netrcbuffer, " \t\n", &tok_buf);
      while(!done && tok) {

        if((*loginp && **loginp) && (*passwordp && **passwordp)) {
          done=TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state=HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state=HOSTVALID;
            retcode=0; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state=HOSTVALID;
            retcode=0; /* we did find our host */
          }
          else
            /* not our host */
            state=NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = strcasecompare(*loginp, tok);
            }
            else {
              free(*loginp);
              *loginp = strdup(tok);
              if(!*loginp) {
                retcode = -1; /* allocation failed */
                goto out;
              }
            }
            state_login=0;
          }
          else if(state_password) {
            if(state_our_login || !specific_login) {
              free(*passwordp);
              *passwordp = strdup(tok);
              if(!*passwordp) {
                retcode = -1; /* allocation failed */
                goto out;
              }
            }
            state_password=0;
          }
          else if(strcasecompare("login", tok))
            state_login=1;
          else if(strcasecompare("password", tok))
            state_password=1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    fclose(file);
  }

  return retcode;
}